

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
 __thiscall
CS248::GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers
          (GLResourceManager *this,FrameBufferId *fbids,int num,int texture_size)

{
  TextureId TVar1;
  TextureId TVar2;
  pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
  pVar3;
  GLsizei in_ECX;
  int in_EDX;
  long in_RSI;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> fb_bind;
  int i;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> tex_bind_1;
  TextureArrayId color_id;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> tex_bind;
  TextureArrayId depth_id;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *puVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  FrameBufferId in_stack_ffffffffffffff9c;
  undefined4 local_60;
  
  TVar1 = createTexture((GLResourceManager *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bindTextureArray((GLResourceManager *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (TextureArrayId)in_stack_ffffffffffffff9c.id);
  puVar5 = (unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)0x0;
  uVar4 = 0;
  (*__glewTexImage3D)(0x8c1a,0,0x1902,in_ECX,in_ECX,in_EDX,0,0x1902,0x1406,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  glTexParameteri(0x8c1a,0x2803,0x812f);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr(puVar5);
  TVar2 = createTexture((GLResourceManager *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
  bindTextureArray((GLResourceManager *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (TextureArrayId)in_stack_ffffffffffffff9c.id);
  puVar5 = (unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)0x0;
  uVar4 = 0;
  (*__glewTexImage3D)(0x8c1a,0,0x1907,in_ECX,in_ECX,in_EDX,0,0x1908,0x1401,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  glTexParameteri(0x8c1a,0x2803,0x812f);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr(puVar5);
  for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
    bindFrameBuffer((GLResourceManager *)
                    CONCAT44(*(undefined4 *)(in_RSI + (long)local_60 * 4),in_stack_ffffffffffffff90)
                    ,in_stack_ffffffffffffff9c);
    (*__glewFramebufferTextureLayer)(0x8d40,0x8d00,TVar1.id,0,local_60);
    (*__glewFramebufferTextureLayer)(0x8d40,0x8ce0,TVar2.id,0,local_60);
    std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr(puVar5);
  }
  pVar3 = std::
          make_pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>&,CS248::internal::GLIntId<CS248::internal::TextureArrayTag>&>
                    ((GLIntId<CS248::internal::TextureArrayTag> *)
                     CONCAT44(in_stack_ffffffffffffff6c,uVar4),
                     (GLIntId<CS248::internal::TextureArrayTag> *)0x1c94d3);
  return pVar3;
}

Assistant:

std::pair<TextureArrayId, TextureArrayId> GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers(const FrameBufferId* fbids, int num, int texture_size) {
  // Texture Array is just one texture
  TextureArrayId depth_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(depth_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_DEPTH_COMPONENT, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_DEPTH_COMPONENT, GL_FLOAT, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  TextureArrayId color_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(color_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_RGB, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  for (int i = 0; i < num; ++i) {
    auto fb_bind = bindFrameBuffer(fbids[i]);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depth_id.id, /*level=*/0, /*layer=*/i);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, color_id.id, /*level=*/0, /*layer=*/i);
  }
  return std::make_pair(depth_id, color_id);
}